

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Outlining.cpp
# Opt level: O2

void __thiscall
wasm::Outlining::moveOutlinedFunctions(Outlining *this,Module *module,uint32_t outlinedCount)

{
  pointer puVar1;
  move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>_>
  __last;
  undefined1 local_50 [8];
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  temp;
  
  puVar1 = (module->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __last._M_current._M_current =
       (__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
        )(module->functions).
         super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  std::
  vector<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>,std::allocator<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>>>
  ::
  vector<std::move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>*,std::vector<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>,std::allocator<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>>>>>,void>
            ((vector<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>,std::allocator<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>>>
              *)local_50,
             (move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>_>
              )((long)__last._M_current._M_current + (ulong)outlinedCount * -8),__last,
             (allocator_type *)
             ((long)&temp.
                     super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>,std::allocator<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>>>
  ::
  insert<std::move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>*,std::vector<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>,std::allocator<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>>>>>,void>
            ((vector<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>,std::allocator<std::unique_ptr<wasm::Function,std::default_delete<wasm::Function>>>>
              *)&module->functions,
             (module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>_>
              )local_50,
             (move_iterator<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>_>
              )temp.
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ::resize(&module->functions,(long)__last._M_current._M_current - (long)puVar1 >> 3);
  Module::updateFunctionsMap(module);
  std::
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ::~vector((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             *)local_50);
  return;
}

Assistant:

void moveOutlinedFunctions(Module* module, uint32_t outlinedCount) {
    // Rearrange outlined functions to the beginning of the functions vector by
    // using std::make_move_iterator to avoid making copies. A temp vector is
    // created to avoid iterator invalidation.
    auto count = module->functions.size();
    std::vector<std::unique_ptr<Function>> temp(
      std::make_move_iterator(module->functions.end() - outlinedCount),
      std::make_move_iterator(module->functions.end()));
    module->functions.insert(module->functions.begin(),
                             std::make_move_iterator(temp.begin()),
                             std::make_move_iterator(temp.end()));
    module->functions.resize(count);
    // After the functions vector is directly manipulated, we need to call
    // updateFunctionsMap().
    module->updateFunctionsMap();
  }